

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeleteView.h
# Opt level: O2

void __thiscall DeleteView<BaseUser>::display(DeleteView<BaseUser> *this)

{
  BaseUser *pBVar1;
  char *pcVar2;
  
  pBVar1 = SingleObjectMixin<BaseUser>::getObject
                     (&this->super_SingleObjectMixin<BaseUser>,
                      (this->super_View).context.requestObjectId);
  if (pBVar1 == (BaseUser *)0x0) {
    pcVar2 = "Not found.\n";
  }
  else {
    (*(pBVar1->super_Model<BaseUser>)._vptr_Model[1])(pBVar1);
    pcVar2 = "Successfully deleted.\n";
  }
  std::operator<<((ostream *)&std::cout,pcVar2);
  return;
}

Assistant:

void DeleteView<T>::display() {
    T *object = SingleObjectMixin<T>::getObject(context.requestObjectId);
    if (object) {
        object->remove();
        cout << "Successfully deleted.\n";
    } else cout << "Not found.\n";
}